

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mqtt.c
# Opt level: O3

MQTTErrors mqtt_subscribe(mqtt_client *client,char *topic_name,int max_qos_level)

{
  mqtt_pal_mutex_t *__mutex;
  mqtt_queued_message *pmVar1;
  uint8_t *puVar2;
  uint uVar3;
  mqtt_queued_message *pmVar4;
  size_t sVar5;
  mqtt_queued_message *pmVar6;
  uint uVar7;
  size_t sVar8;
  uint16_t uVar9;
  uint uVar10;
  MQTTErrors MVar11;
  
  __mutex = &client->mutex;
  pthread_mutex_lock((pthread_mutex_t *)__mutex);
  uVar3._0_2_ = client->pid_lfsr;
  uVar3._2_2_ = client->keep_alive;
  uVar10 = 0xa3;
  if ((undefined2)uVar3 != 0) {
    uVar10 = uVar3;
  }
  pmVar1 = (mqtt_queued_message *)(client->mq).mem_end;
  do {
    uVar7 = (uVar10 & 0xffff) >> 1;
    uVar3 = uVar10 & 1;
    pmVar6 = pmVar1;
    uVar10 = uVar7 ^ 0xffffb400;
    if (uVar3 == 0) {
      uVar10 = uVar7;
    }
    do {
      uVar9 = (uint16_t)uVar10;
      if (pmVar6 + -1 < (client->mq).queue_tail) {
        client->pid_lfsr = uVar9;
        if (client->error < 0) {
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          return client->error;
        }
        sVar5 = mqtt_pack_subscribe_request
                          ((client->mq).curr,(client->mq).curr_sz,uVar10 & 0xffff,topic_name,
                           (ulong)(uint)max_qos_level,0);
        if ((long)sVar5 < 0) {
LAB_00102ebe:
          MVar11 = (MQTTErrors)sVar5;
          client->error = MVar11;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
        }
        else {
          if (sVar5 == 0) {
            mqtt_mq_clean(&client->mq);
            sVar5 = mqtt_pack_subscribe_request
                              ((client->mq).curr,(client->mq).curr_sz,uVar10 & 0xffff,topic_name,
                               (ulong)(uint)max_qos_level,0);
            if ((long)sVar5 < 0) goto LAB_00102ebe;
            if (sVar5 == 0) {
              client->error = MQTT_ERROR_SEND_BUFFER_IS_FULL;
              pthread_mutex_unlock((pthread_mutex_t *)__mutex);
              return MQTT_ERROR_SEND_BUFFER_IS_FULL;
            }
          }
          puVar2 = (client->mq).curr;
          pmVar1 = (client->mq).queue_tail;
          (client->mq).queue_tail = pmVar1 + -1;
          pmVar1[-1].start = puVar2;
          pmVar1[-1].size = sVar5;
          pmVar1[-1].state = MQTT_QUEUED_UNSENT;
          pmVar6 = (mqtt_queued_message *)(puVar2 + sVar5);
          sVar8 = (long)(pmVar1 + -2) - (long)pmVar6;
          sVar5 = 0;
          if (pmVar6 <= pmVar1 + -2 && sVar8 != 0) {
            sVar5 = sVar8;
          }
          (client->mq).curr = (uint8_t *)pmVar6;
          (client->mq).curr_sz = sVar5;
          pmVar1[-1].control_type = MQTT_CONTROL_SUBSCRIBE;
          pmVar1[-1].packet_id = uVar9;
          pthread_mutex_unlock((pthread_mutex_t *)__mutex);
          MVar11 = MQTT_OK;
        }
        return MVar11;
      }
      pmVar4 = pmVar6 + -1;
      pmVar6 = pmVar6 + -1;
    } while (pmVar4->packet_id != uVar9);
  } while( true );
}

Assistant:

enum MQTTErrors mqtt_subscribe(struct mqtt_client *client,
                       const char* topic_name,
                       int max_qos_level)
{
    ssize_t rv;
    uint16_t packet_id;
    struct mqtt_queued_message *msg;
    MQTT_PAL_MUTEX_LOCK(&client->mutex);
    packet_id = __mqtt_next_pid(client);

    /* try to pack the message */
    MQTT_CLIENT_TRY_PACK(
        rv, msg, client, 
        mqtt_pack_subscribe_request(
            client->mq.curr, client->mq.curr_sz,
            packet_id,
            topic_name,
            max_qos_level,
            (const char*)NULL
        ), 
        1
    );
    /* save the control type and packet id of the message */
    msg->control_type = MQTT_CONTROL_SUBSCRIBE;
    msg->packet_id = packet_id;

    MQTT_PAL_MUTEX_UNLOCK(&client->mutex);
    return MQTT_OK;
}